

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O0

int FeederBig3(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  clock_t cVar3;
  clock_t cVar4;
  size_t sVar5;
  size_t sVar6;
  size_t memoryForChars;
  size_t memoryForTreeNodes;
  size_t memoryForRecursion;
  clock_t end;
  char local_808 [4];
  int j;
  char output [2001];
  int local_28;
  int i;
  int n;
  clock_t start;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  printf("Creating Large test... ");
  cVar3 = clock();
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",0xcb21);
    for (local_28 = 0; local_28 < 0x1a; local_28 = local_28 + 1) {
      memset(local_808,0,0x7d1);
      for (end._4_4_ = 0; end._4_4_ < 2000; end._4_4_ = end._4_4_ + 1) {
        local_808[end._4_4_] = (char)local_28 + 'a';
        iVar1 = fprintf(__stream,"%s\n",local_808);
        if (iVar1 < 0) {
          printf("can\'t create in.txt. No space on disk?\n");
          return -1;
        }
      }
    }
    fprintf(__stream,"abacaba\naba");
    cVar4 = clock();
    fclose(__stream);
    testTimeOut = (int)cVar4 - (int)cVar3;
    uVar2 = RoundUptoThousand(testTimeOut);
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ",(ulong)uVar2 / 1000000
           ,(ulong)uVar2 % 1000000);
    testTimeOut = testTimeOut + 3000000;
    sVar5 = GetLabPointerSize();
    sVar6 = GetLabPointerSize();
    LabMemoryLimit = (sVar5 + 8 + sVar6 * 2) * 0xcb21 + 0x53d620;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeederBig3(void) {
    FILE *const in = fopen("in.txt", "w+");
    printf("Creating Large test... ");
    clock_t start = clock();
    int n = MAX_WORD_LENGTH / 5 * ALPHABET_SIZE;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", n + 1);
    for (int i = 0; i < ALPHABET_SIZE; i++) {
        char output[MAX_WORD_LENGTH / 5 + 1] = "";
        for (int j = 0; j < MAX_WORD_LENGTH / 5; j++) {
            output[j] = 'a' + i;
            if (fprintf(in, "%s\n", output) < 0) {
                printf("can't create in.txt. No space on disk?\n");
                return -1;
            }
        }
    }
    fprintf(in, "abacaba\naba");
    clock_t end = clock();
    fclose(in);
    testTimeOut = end - start;
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ", RoundUptoThousand(testTimeOut) / CLOCKS_PER_SEC);
    testTimeOut = testTimeOut + CLOCKS_PER_SEC * 3;
    size_t memoryForRecursion = n * (sizeof(void *) * 3);
    size_t memoryForTreeNodes = (n + 1) * (GetLabPointerSize() + sizeof(int) * 2 + 2 * GetLabPointerSize());
    size_t memoryForChars = n * sizeof(char);
    LabMemoryLimit = memoryForChars + memoryForTreeNodes + memoryForRecursion + MIN_PROCESS_RSS_BYTES;
    return 0;
}